

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

XrResult ApiDumpLayerXrCreatePassthroughFB
                   (XrSession session,XrPassthroughCreateInfoFB *createInfo,
                   XrPassthroughFB *outPassthrough)

{
  XrGeneratedDispatchTable *gen_dispatch_table;
  long lVar1;
  bool bVar2;
  XrResult XVar3;
  iterator iVar4;
  iterator iVar5;
  mapped_type *ppXVar6;
  invalid_argument *this;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  unique_lock<std::mutex> lock;
  ostringstream oss_outPassthrough;
  ostringstream oss_session;
  XrSession local_3c0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b8;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  string local_378;
  string local_358;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  unique_lock<std::mutex> local_1a8;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_3b8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._M_device = &g_session_dispatch_mutex;
  local_1a8._M_owns = false;
  local_3c0 = session;
  std::unique_lock<std::mutex>::lock(&local_1a8);
  local_1a8._M_owns = true;
  iVar4 = std::
          _Hashtable<XrSession_T_*,_std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrSession_T_*>,_std::hash<XrSession_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_session_dispatch_map._M_h,&local_3c0);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    std::unique_lock<std::mutex>::~unique_lock(&local_1a8);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    gen_dispatch_table =
         *(XrGeneratedDispatchTable **)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false>
                 ._M_cur + 0x10);
    std::unique_lock<std::mutex>::~unique_lock(&local_1a8);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[22],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_3b8,(char (*) [9])"XrResult",(char (*) [22])"xrCreatePassthroughFB",
               (char (*) [1])0x29fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    lVar1 = *(long *)((long)&local_1a8._M_device[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_190 + lVar1) = *(uint *)((long)auStack_190 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&local_1a8);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[8],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_3b8,(char (*) [10])"XrSession",(char (*) [8])"session",local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"createInfo","");
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_378,"const XrPassthroughCreateInfoFB*","");
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table,createInfo,&local_358,&local_378,true,&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_320[0].field_2 +
                  *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_320);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[17],char_const(&)[15],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_3b8,(char (*) [17])"XrPassthroughFB*",(char (*) [15])"outPassthrough",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._0_8_ != &local_388) {
      operator_delete((void *)local_398._0_8_,local_388._M_allocated_capacity + 1);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_338,&local_3b8);
    ApiDumpLayerRecordContent(&local_338);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_338);
    XVar3 = (*gen_dispatch_table->CreatePassthroughFB)(local_3c0,createInfo,outPassthrough);
    if ((outPassthrough != (XrPassthroughFB *)0x0) && (XVar3 == XR_SUCCESS)) {
      iVar5 = std::
              _Hashtable<XrPassthroughFB_T_*,_std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughFB_T_*>,_std::hash<XrPassthroughFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&g_passthroughfb_dispatch_map._M_h,outPassthrough);
      if (iVar5.
          super__Node_iterator_base<std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_398._0_8_ = &g_passthroughfb_dispatch_mutex;
        local_398[8] = false;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_398);
        local_398[8] = true;
        ppXVar6 = std::__detail::
                  _Map_base<XrPassthroughFB_T_*,_std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughFB_T_*>,_std::hash<XrPassthroughFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<XrPassthroughFB_T_*,_std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughFB_T_*>,_std::hash<XrPassthroughFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&g_passthroughfb_dispatch_map,outPassthrough);
        *ppXVar6 = gen_dispatch_table;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_398);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_3b8);
  return XVar3;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrCreatePassthroughFB(
    XrSession session,
    const XrPassthroughCreateInfoFB* createInfo,
    XrPassthroughFB* outPassthrough) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_session_dispatch_mutex);
            auto map_iter = g_session_dispatch_map.find(session);
            if (map_iter == g_session_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrCreatePassthroughFB", "");
        std::ostringstream oss_session;
        oss_session << std::hex << reinterpret_cast<const void*>(session);
        contents.emplace_back("XrSession", "session", oss_session.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, createInfo, "createInfo", "const XrPassthroughCreateInfoFB*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_outPassthrough;
        oss_outPassthrough << std::hex << reinterpret_cast<const void*>(outPassthrough);
        contents.emplace_back("XrPassthroughFB*", "outPassthrough", oss_outPassthrough.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->CreatePassthroughFB(session, createInfo, outPassthrough);
        if (XR_SUCCESS == result && nullptr != outPassthrough) {
            auto exists = g_passthroughfb_dispatch_map.find(*outPassthrough);
            if (exists == g_passthroughfb_dispatch_map.end()) {
                std::unique_lock<std::mutex> lock(g_passthroughfb_dispatch_mutex);
                g_passthroughfb_dispatch_map[*outPassthrough] = gen_dispatch_table;
            }
        }
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}